

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opensketch.h
# Opt level: O2

void __thiscall OpenSketch<4U>::~OpenSketch(OpenSketch<4U> *this)

{
  BitSet *pBVar1;
  uchar *puVar2;
  long lVar3;
  
  (this->super_Abstract<4U>)._vptr_Abstract = (_func_int **)&PTR_Init_00111cb8;
  if (this->heap != (KV<4U> *)0x0) {
    operator_delete__(this->heap);
  }
  pBVar1 = this->bitset;
  if (pBVar1 != (BitSet *)0x0) {
    puVar2 = pBVar1[-1].bitset;
    if (puVar2 != (uchar *)0x0) {
      lVar3 = (long)puVar2 << 4;
      do {
        BitSet::~BitSet((BitSet *)((long)&pBVar1[-1].LENGTH + lVar3));
        lVar3 = lVar3 + -0x10;
      } while (lVar3 != 0);
    }
    operator_delete__(&pBVar1[-1].bitset,(long)puVar2 << 4 | 8);
  }
  if (this->counter != (int *)0x0) {
    operator_delete__(this->counter);
  }
  std::
  _Hashtable<Data<4U>,_std::pair<const_Data<4U>,_int>,_std::allocator<std::pair<const_Data<4U>,_int>_>,_std::__detail::_Select1st,_std::equal_to<Data<4U>_>,_My_Hash<4U>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&(this->mp)._M_h);
  Abstract<4U>::~Abstract(&this->super_Abstract<4U>);
  return;
}

Assistant:

~OpenSketch() {
		delete[] heap;
		delete[] bitset;
		delete[] counter;
	}